

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O2

void __thiscall FArchive::UserReadClass(FArchive *this,PClass **type)

{
  PClass *pPVar1;
  BYTE newclass;
  
  (*this->_vptr_FArchive[3])(this,&newclass,1);
  if (newclass == '\x02') {
    *type = (PClass *)0x0;
  }
  else {
    if (newclass == '\x01') {
      pPVar1 = ReadClass(this);
    }
    else {
      if (newclass != '\0') {
        I_Error("Unknown class type %d in archive.\n");
        return;
      }
      pPVar1 = ReadStoredClass(this,DObject::RegistrationInfo.MyClass);
    }
    *type = pPVar1;
  }
  return;
}

Assistant:

void FArchive::UserReadClass (PClass *&type)
{
	BYTE newclass;

	Read (&newclass, 1);
	switch (newclass)
	{
	case 0:
		type = ReadStoredClass (RUNTIME_CLASS(DObject));
		break;
	case 1:
		type = ReadClass ();
		break;
	case 2:
		type = NULL;
		break;
	default:
		I_Error ("Unknown class type %d in archive.\n", newclass);
		break;
	}
}